

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luajit.c
# Opt level: O1

int pushline(lua_State *L,int firstline)

{
  size_t sVar1;
  char *pcVar2;
  int iVar3;
  char *__s;
  char buf [512];
  undefined8 uStack_230;
  char local_228;
  undefined1 local_227 [511];
  
  pcVar2 = "_PROMPT";
  if (firstline == 0) {
    pcVar2 = "_PROMPT2";
  }
  __s = "> ";
  if (firstline == 0) {
    __s = ">> ";
  }
  uStack_230 = 0x1088aa;
  lua_getfield(L,-0x2712,pcVar2);
  iVar3 = 0;
  uStack_230 = 0x1088bc;
  pcVar2 = lua_tolstring(L,-1,(size_t *)0x0);
  if (pcVar2 != (char *)0x0) {
    __s = pcVar2;
  }
  uStack_230 = 0x1088d6;
  fputs(__s,_stdout);
  uStack_230 = 0x1088df;
  fflush(_stdout);
  uStack_230 = 0x1088ec;
  lua_settop(L,-2);
  uStack_230 = 0x108903;
  pcVar2 = fgets(&local_228,0x200,_stdin);
  if (pcVar2 != (char *)0x0) {
    uStack_230 = 0x108913;
    sVar1 = strlen(&local_228);
    if ((sVar1 != 0) && (*(char *)((long)&uStack_230 + sVar1 + 7) == '\n')) {
      *(undefined1 *)((long)&uStack_230 + sVar1 + 7) = 0;
    }
    if ((firstline == 0) || (local_228 != '=')) {
      uStack_230 = 0x108952;
      lua_pushstring(L,&local_228);
    }
    else {
      uStack_230 = 0x108945;
      lua_pushfstring(L,"return %s",local_227);
    }
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int pushline(lua_State *L, int firstline)
{
  char buf[LUA_MAXINPUT];
  write_prompt(L, firstline);
  if (fgets(buf, LUA_MAXINPUT, stdin)) {
    size_t len = strlen(buf);
    if (len > 0 && buf[len-1] == '\n')
      buf[len-1] = '\0';
    if (firstline && buf[0] == '=')
      lua_pushfstring(L, "return %s", buf+1);
    else
      lua_pushstring(L, buf);
    return 1;
  }
  return 0;
}